

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanEqualTest<unsigned_int,short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2e;
  int local_2c [2];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_24;
  int local_20;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1c;
  int local_18;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_14;
  
  local_18 = 3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_14,&local_18);
  if (local_14.m_int < 3) {
    local_20 = 4;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>(&local_1c,&local_20);
    if (4 < local_1c.m_int) {
      local_2c[1] = 6;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>(&local_24,local_2c + 1);
      local_2c[0] = 7;
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>(&local_2e,local_2c);
      return (long)local_2e.m_int <= (long)(ulong)local_24.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanEqualTest()
	{
		return
			(U)2 >= SafeInt<T>(3) &&
			SafeInt<T>(4) >= (U)5 &&
			SafeInt<T>(6) >= SafeInt<U>(7);
	}